

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_stressbuffer(char *args)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  time_t tVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  char buf [37];
  char buf2 [37];
  
  pcVar13 = args;
  if (*args == '\"') {
    pcVar13 = args + 1;
    sVar5 = strlen(pcVar13);
    args[sVar5] = '\0';
  }
  uVar1 = atoi(pcVar13);
  if (-1 < (int)uVar1) {
    printf("Stress testing with (%d) byte buffer...\n",(ulong)uVar1);
    lVar6 = PHYSFS_openWrite("test.txt");
    if (lVar6 != 0) {
      iVar2 = PHYSFS_setBuffer(lVar6,uVar1);
      if (iVar2 == 0) {
        uVar9 = PHYSFS_getLastError();
        printf("PHYSFS_setBuffer() failed: %s.\n",uVar9);
        PHYSFS_close(lVar6);
        PHYSFS_delete("test.txt");
        return 1;
      }
      builtin_strncpy(buf,"abcdefghijklmnopqrstuvwxyz0123456789",0x25);
      iVar2 = 0;
      tVar7 = time((time_t *)0x0);
      srand((uint)tVar7);
      do {
        if (iVar2 == 10) {
          iVar2 = PHYSFS_close(lVar6);
          if (iVar2 == 0) goto LAB_00104ee4;
          puts(" ... test file written ...");
          lVar6 = PHYSFS_openRead("test.txt");
          if (lVar6 == 0) {
            uVar9 = PHYSFS_getLastError();
            pcVar13 = "Failed to reopen stress file for reading: %s.\n";
            goto LAB_00104c19;
          }
          iVar2 = PHYSFS_setBuffer(lVar6,uVar1);
          if (iVar2 != 0) {
            uVar1 = 0;
            goto LAB_00104cd1;
          }
          uVar9 = PHYSFS_getLastError();
          pcVar13 = "PHYSFS_setBuffer() failed: %s.\n";
          goto LAB_00104c31;
        }
        iVar14 = 10000;
        while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
          iVar3 = rand();
          iVar3 = (int)(long)((double)iVar3 * 35.0 * 4.656612873077393e-10);
          uVar10 = (ulong)(0x23 - iVar3);
          uVar8 = PHYSFS_writeBytes(lVar6,buf,uVar10);
          if (uVar8 != uVar10) {
LAB_00104c25:
            uVar9 = PHYSFS_getLastError();
            pcVar13 = "PHYSFS_writeBytes() failed: %s.\n";
            goto LAB_00104c31;
          }
          iVar4 = rand();
          if (((int)((double)iVar4 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
             (iVar4 = PHYSFS_flush(lVar6), iVar4 == 0)) goto LAB_00104bf1;
          uVar11 = (ulong)(iVar3 + 1);
          uVar8 = PHYSFS_writeBytes(lVar6,buf + uVar10,uVar11);
          if (uVar8 != uVar11) goto LAB_00104c25;
          iVar3 = rand();
          if (((int)((double)iVar3 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
             (iVar3 = PHYSFS_flush(lVar6), iVar3 == 0)) goto LAB_00104bf1;
        }
        iVar14 = PHYSFS_flush(lVar6);
        iVar2 = iVar2 + 1;
      } while (iVar14 != 0);
LAB_00104bf1:
      uVar9 = PHYSFS_getLastError();
      pcVar13 = "PHYSFS_flush() failed: %s.\n";
LAB_00104c31:
      printf(pcVar13,uVar9);
LAB_00104c3b:
      PHYSFS_close(lVar6);
      return 1;
    }
    uVar9 = PHYSFS_getLastError();
    pcVar13 = "Couldn\'t open test.txt for writing: %s.\n";
    goto LAB_00104c19;
  }
  pcVar13 = "buffer must be greater than or equal to zero.";
  goto LAB_00104c06;
LAB_00104cd1:
  if (uVar1 == 10) goto LAB_00104e9c;
  for (uVar8 = 0; (int)uVar8 != 10000; uVar8 = (ulong)((int)uVar8 + 1)) {
    iVar2 = rand();
    iVar2 = (int)(long)((double)iVar2 * 35.0 * 4.656612873077393e-10);
    uVar11 = (ulong)(0x23 - iVar2);
    uVar10 = PHYSFS_readBytes(lVar6,buf2,uVar11);
    if (uVar10 != uVar11) {
LAB_00104e0c:
      uVar9 = PHYSFS_getLastError();
      pcVar13 = "PHYSFS_readBytes() failed: %s.\n";
      goto LAB_00104c31;
    }
    iVar14 = rand();
    if (((int)((double)iVar14 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
       (iVar14 = PHYSFS_flush(lVar6), iVar14 == 0)) goto LAB_00104bf1;
    uVar12 = (ulong)(iVar2 + 1);
    uVar10 = PHYSFS_readBytes(lVar6,buf2 + uVar11,uVar12);
    if (uVar10 != uVar12) goto LAB_00104e0c;
    iVar2 = rand();
    if (((int)((double)iVar2 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
       (iVar2 = PHYSFS_flush(lVar6), iVar2 == 0)) goto LAB_00104bf1;
    iVar2 = bcmp(buf,buf2,0x24);
    if (iVar2 != 0) {
      printf("readback is mismatched on iterations (%d, %d).\n",(ulong)uVar1,uVar8);
      printf("wanted: [");
      for (lVar15 = 0; lVar15 != 0x24; lVar15 = lVar15 + 1) {
        putchar((int)buf[lVar15]);
      }
      puts("]");
      printf("   got: [");
      for (lVar15 = 0; lVar15 != 0x24; lVar15 = lVar15 + 1) {
        putchar((int)buf2[lVar15]);
      }
      puts("]");
      goto LAB_00104c3b;
    }
  }
  iVar2 = PHYSFS_flush(lVar6);
  if (iVar2 == 0) goto LAB_00104bf1;
  uVar1 = uVar1 + 1;
  goto LAB_00104cd1;
LAB_00104e9c:
  puts(" ... test file read ...");
  iVar2 = PHYSFS_eof(lVar6);
  if (iVar2 == 0) {
    puts("PHYSFS_eof() returned true! That\'s wrong.");
  }
  iVar2 = PHYSFS_close(lVar6);
  if (iVar2 == 0) {
LAB_00104ee4:
    uVar9 = PHYSFS_getLastError();
    pcVar13 = "PHYSFS_close() failed: %s.\n";
LAB_00104c19:
    printf(pcVar13,uVar9);
    return 1;
  }
  PHYSFS_delete("test.txt");
  pcVar13 = "stress test completed successfully.";
LAB_00104c06:
  puts(pcVar13);
  return 1;
}

Assistant:

static int cmd_stressbuffer(char *args)
{
    int num;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    num = atoi(args);
    if (num < 0)
        printf("buffer must be greater than or equal to zero.\n");
    else
    {
        PHYSFS_File *f;
        int rndnum;

        printf("Stress testing with (%d) byte buffer...\n", num);
        f = PHYSFS_openWrite("test.txt");
        if (f == NULL)
            printf("Couldn't open test.txt for writing: %s.\n", PHYSFS_getLastError());
        else
        {
            int i, j;
            char buf[37];
            char buf2[37];

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                PHYSFS_delete("test.txt");
                return 1;
            } /* if */

            strcpy(buf, "abcdefghijklmnopqrstuvwxyz0123456789");
            srand((unsigned int) time(NULL));

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_writeBytes(f, buf, left) != left)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_writeBytes(f, buf + left, right) != right)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            printf(" ... test file written ...\n");
            f = PHYSFS_openRead("test.txt");
            if (f == NULL)
            {
                printf("Failed to reopen stress file for reading: %s.\n", PHYSFS_getLastError());
                return 1;
            } /* if */

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_readBytes(f, buf2, left) != left)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_readBytes(f, buf2 + left, right) != right)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (memcmp(buf, buf2, 36) != 0)
                    {
                        printf("readback is mismatched on iterations (%d, %d).\n", i, j);
                        printf("wanted: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf[i]);
                        printf("]\n");

                        printf("   got: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf2[i]);
                        printf("]\n");
                        PHYSFS_close(f);
                        return 1;
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            printf(" ... test file read ...\n");

            if (!PHYSFS_eof(f))
                printf("PHYSFS_eof() returned true! That's wrong.\n");

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            PHYSFS_delete("test.txt");
            printf("stress test completed successfully.\n");
        } /* else */
    } /* else */

    return 1;
}